

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O3

void __thiscall
pbrt::MLTSampler::StartPixelSample(MLTSampler *this,Point2i *p,int sampleIndex,int dim)

{
  long lVar1;
  uint64_t uVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  uint64_t uVar9;
  long lVar10;
  
  uVar7 = (long)(p->super_Tuple2<pbrt::Point2,_int>).y * 0x10000 +
          (long)(p->super_Tuple2<pbrt::Point2,_int>).x;
  iVar4 = dim * 0x2000 + sampleIndex * 0x10000;
  uVar2 = uVar7 * 2 + 1;
  (this->rng).inc = uVar2;
  if (iVar4 == 0) {
    lVar6 = 1;
    lVar5 = 0;
  }
  else {
    lVar6 = 1;
    lVar5 = 0;
    lVar10 = 0x5851f42d4c957f2d;
    uVar8 = (long)iVar4;
    uVar9 = uVar2;
    do {
      if ((uVar8 & 1) != 0) {
        lVar6 = lVar6 * lVar10;
        lVar5 = lVar5 * lVar10 + uVar9;
      }
      lVar1 = lVar10 + 1;
      lVar10 = lVar10 * lVar10;
      uVar9 = uVar9 * lVar1;
      bVar3 = 1 < uVar8;
      uVar8 = uVar8 >> 1;
    } while (bVar3);
  }
  uVar7 = (uVar7 >> 0x1f ^ uVar7) * 0x7fb5d329728ea185;
  uVar7 = (uVar7 >> 0x1b ^ uVar7) * -0x7e25210b43d22bb3;
  (this->rng).state =
       ((uVar7 >> 0x21 ^ uVar7) * 0x5851f42d4c957f2d + uVar2 * 0x5851f42d4c957f2e) * lVar6 + lVar5;
  return;
}

Assistant:

PBRT_CPU_GPU
    void StartPixelSample(const Point2i &p, int sampleIndex, int dim) {
        rng.SetSequence(p.x + p.y * 65536);
        rng.Advance(sampleIndex * 65536 + dim * 8192);
    }